

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O1

int __thiscall
CVmObjHTTPRequest::getp_getBody
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  long lVar1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  anon_union_8_8_cb74652f_for_val aVar4;
  vm_val_t *pvVar5;
  int iVar6;
  vm_obj_id_t vVar7;
  CVmDataSource *fp;
  undefined8 *puVar8;
  char *ct;
  vm_val_t charset;
  vm_val_t local_38;
  
  if (getp_getBody(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_getBody();
  }
  iVar6 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getBody::desc);
  if (iVar6 == 0) {
    lVar1 = *(long *)(this->super_CVmObject).ext_;
    if (*(int *)(lVar1 + 0x68) == 0) {
      pp_Var2 = *(_func_int ***)(lVar1 + 0x60);
      if (pp_Var2 == (_func_int **)0x0) {
        retval->typ = VM_NIL;
      }
      else {
        puVar8 = *(undefined8 **)(lVar1 + 0x58);
        fp = (CVmDataSource *)operator_new(0x28);
        pp_Var3 = (_func_int **)pp_Var2[3];
        fp[1]._vptr_CVmDataSource = (_func_int **)pp_Var2[2];
        fp[2]._vptr_CVmDataSource = pp_Var3;
        fp[3]._vptr_CVmDataSource = (_func_int **)0x0;
        fp->_vptr_CVmDataSource = (_func_int **)&PTR__CVmStringRefSource_00352700;
        fp[4]._vptr_CVmDataSource = pp_Var2;
        LOCK();
        pp_Var2[1] = pp_Var2[1] + 1;
        UNLOCK();
        ct = (char *)0x0;
        do {
          iVar6 = stricmp((char *)*puVar8,"content-type");
          if (iVar6 == 0) {
            ct = (char *)puVar8[1];
            break;
          }
          puVar8 = (undefined8 *)puVar8[2];
        } while (puVar8 != (undefined8 *)0x0);
        iVar6 = get_charset_map(ct,&local_38);
        pvVar5 = sp_;
        aVar4._4_4_ = local_38.val._4_4_;
        aVar4.obj = local_38.val.obj;
        sp_ = sp_ + 1;
        pvVar5->typ = local_38.typ;
        *(undefined4 *)&pvVar5->field_0x4 = local_38._4_4_;
        pvVar5->val = aVar4;
        vVar7 = CVmObjFile::create(0,(CVmNetFile *)0x0,local_38.val.obj,fp,iVar6,1,1);
        retval->typ = VM_OBJ;
        (retval->val).obj = vVar7;
        sp_ = sp_ + -1;
      }
    }
    else {
      vVar7 = CVmObjString::create(0,"overflow",8);
      retval->typ = VM_OBJ;
      (retval->val).obj = vVar7;
    }
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_getBody(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *oargc)
{
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* retrieve the headers from the request */
    TadsHttpRequest *req = get_ext()->req;
    TadsHttpRequestHeader *hdrs = req->hdr_list;
    StringRef *body = req->body;

    /* if the body was too large, return 'overflow' */
    if (req->overflow)
    {
        retval->set_obj(CVmObjString::create(vmg_ FALSE, "overflow", 8));
        return TRUE;
    }

    /* if there's no body, return nil */
    if (body == 0)
    {
        retval->set_nil();
        return TRUE;
    }

    /* create a data source for the body */
    CVmStringRefSource *sbody = new CVmStringRefSource(body);

    /* for a text content type, get the character mapper */
    vm_val_t charset;
    int mode = get_charset_map(vmg_ hdrs->find("content-type"), &charset);
    G_stk->push(&charset);

    /* create a File object to access the body data source */
    retval->set_obj(CVmObjFile::create(
        vmg_ FALSE, 0, charset.val.obj, sbody, mode,
        VMOBJFILE_ACCESS_READ, TRUE));

    /* discard the gc protection */
    G_stk->discard();
                                       
    /* handled */
    return TRUE;
}